

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

int __thiscall wabt::WastLexer::ReadReservedChars(WastLexer *this)

{
  int iVar1;
  byte *pbVar2;
  long lVar3;
  
  pbVar2 = (byte *)this->cursor_;
  iVar1 = 0;
  while( true ) {
    if (pbVar2 < this->buffer_end_) {
      lVar3 = (ulong)*pbVar2 + 1;
    }
    else {
      lVar3 = 0;
    }
    if ((""[lVar3] & 1U) == 0) break;
    if (pbVar2 < this->buffer_end_) {
      pbVar2 = pbVar2 + 1;
      this->cursor_ = (char *)pbVar2;
    }
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

int WastLexer::ReadReservedChars() {
  int count = 0;
  while (IsReserved(PeekChar())) {
    ReadChar();
    ++count;
  }
  return count;
}